

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * new_field_selector(ParserState *parser,StringObject *ts)

{
  AstNode *pAVar1;
  AstNode *pAVar2;
  AstNode *index;
  StringObject *ts_local;
  ParserState *parser_local;
  
  pAVar1 = allocate_expr_ast_node(parser,EXPR_FIELD_SELECTOR);
  pAVar2 = new_string_literal(parser,ts);
  (pAVar1->field_2).function_stmt.function_expr = pAVar2;
  set_type((VariableType *)&(pAVar1->field_2).return_stmt,RAVI_TANY);
  return pAVar1;
}

Assistant:

static AstNode *new_field_selector(ParserState *parser, const StringObject *ts)
{
	AstNode *index = allocate_expr_ast_node(parser, EXPR_FIELD_SELECTOR);
	index->index_expr.expr = new_string_literal(parser, ts);
	set_type(&index->index_expr.type, RAVI_TANY);
	return index;
}